

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_free(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor,
             int remove_from_ctx)

{
  long lVar1;
  int iVar2;
  ly_ctx *ctx;
  lys_module **pplVar3;
  long lVar4;
  
  if (module == (lys_module *)0x0) {
    return;
  }
  ctx = module->ctx;
  if (remove_from_ctx != 0) {
    iVar2 = (ctx->models).used;
    if (0 < (long)iVar2) {
      pplVar3 = (ctx->models).list;
      lVar1 = (long)iVar2 * 8;
      lVar4 = 0;
      do {
        if (*(lys_module **)((long)pplVar3 + lVar4) == module) {
          (ctx->models).used = iVar2 + -1;
          memmove((void *)((long)pplVar3 + lVar4),*(void **)((long)pplVar3 + lVar4 + 8),
                  (lVar1 - lVar4) - 8);
          (ctx->models).list[(ctx->models).used] = (lys_module *)0x0;
          break;
        }
        lVar4 = lVar4 + 8;
      } while (lVar1 - lVar4 != 0);
    }
  }
  module_free_common(module,private_destructor);
  lydict_remove(ctx,module->ns);
  free(module);
  return;
}

Assistant:

void
lys_free(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv), int remove_from_ctx)
{
    struct ly_ctx *ctx;
    int i;

    if (!module) {
        return;
    }

    /* remove schema from the context */
    ctx = module->ctx;
    if (remove_from_ctx && ctx->models.used) {
        for (i = 0; i < ctx->models.used; i++) {
            if (ctx->models.list[i] == module) {
                /* move all the models to not change the order in the list */
                ctx->models.used--;
                memmove(&ctx->models.list[i], ctx->models.list[i + 1], (ctx->models.used - i) * sizeof *ctx->models.list);
                ctx->models.list[ctx->models.used] = NULL;
                /* we are done */
                break;
            }
        }
    }

    /* common part with struct ly_submodule */
    module_free_common(module, private_destructor);

    /* specific items to free */
    lydict_remove(ctx, module->ns);

    free(module);
}